

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph-flooding.c
# Opt level: O1

void mpr_calculate_neighbor_graph_flooding(nhdp_domain *domain,mpr_flooding_data *data)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-flooding.c",0x115,0,0,
             "Calculate neighbor graph for flooding MPRs");
  }
  mpr_init_neighbor_graph(&data->neigh_graph,&_api_interface);
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-flooding.c",0xde,0,0,
             "Calculate N1 (flooding) for interface %s",(data->current_interface->_node).key);
  }
  plVar1 = nhdp_db_get_link_list();
  plVar1 = plVar1->next;
  while( true ) {
    plVar3 = plVar1->prev;
    plVar2 = nhdp_db_get_link_list();
    if (plVar3 == plVar2->prev) break;
    *(undefined1 *)((long)&plVar1[-9].next[2].next + 4) = 0;
    if (((((nhdp_interface *)plVar1[-10].next == data->current_interface) &&
         (*(uint *)((long)&plVar1[(long)domain->index + 6].prev + 4) < 0xffff01)) &&
        (*(int *)((long)&plVar1[-0xb].prev + 4) == 1)) &&
       (*(char *)((long)&plVar1[-6].prev + 2) != '\0')) {
      mpr_add_n1_node_to_set
                (&(data->neigh_graph).set_n1,(nhdp_neighbor *)plVar1[-9].next,
                 (nhdp_link *)&plVar1[-0x1e].prev,0);
    }
    plVar1 = plVar1->next;
  }
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-flooding.c",0xfc,0,0,
             "Calculate N2 for flooding MPRs");
  }
  plVar1 = (data->neigh_graph).set_n1.list_head.next;
  if (plVar1->prev != (data->neigh_graph).set_n1.list_head.prev) {
    do {
      plVar3 = plVar1[-1].next[0x1b].next;
      if (plVar3->prev != plVar1[-1].next[0x1b].prev) {
        do {
          if (((nhdp_interface *)plVar3[-7].prev[0x13].prev == data->current_interface) &&
             (*(uint *)((long)&plVar3[7].next + (long)domain->index * 0xc + 4U) < 0xffff01)) {
            mpr_add_addr_node_to_set(&(data->neigh_graph).set_n2,*(netaddr *)(plVar3 + -8),0);
          }
          plVar3 = plVar3->next;
        } while (plVar3->prev != plVar1[-1].next[0x1b].prev);
      }
      plVar1 = plVar1->next;
    } while (plVar1->prev != (data->neigh_graph).set_n1.list_head.prev);
  }
  return;
}

Assistant:

void
mpr_calculate_neighbor_graph_flooding(const struct nhdp_domain *domain, struct mpr_flooding_data *data) {
  OONF_DEBUG(LOG_MPR, "Calculate neighbor graph for flooding MPRs");

  mpr_init_neighbor_graph(&data->neigh_graph, &_api_interface);
  _calculate_n1(domain, data);
  _calculate_n2(domain, data);
}